

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hist.c
# Opt level: O0

size_t HIST_count_parallel_wksp
                 (uint *count,uint *maxSymbolValuePtr,void *source,size_t sourceSize,
                 HIST_checkInput_e check,U32 *workSpace)

{
  U32 UVar1;
  U32 UVar2;
  size_t __n;
  ulong uVar3;
  uint local_90;
  uint local_8c;
  uint maxSymbolValue;
  U32 s;
  U32 c;
  U32 cached;
  U32 *Counting4;
  U32 *Counting3;
  U32 *Counting2;
  U32 *Counting1;
  uint max;
  size_t countSize;
  BYTE *iend;
  BYTE *ip;
  U32 *workSpace_local;
  HIST_checkInput_e check_local;
  size_t sourceSize_local;
  void *source_local;
  uint *maxSymbolValuePtr_local;
  uint *count_local;
  
  __n = (ulong)(*maxSymbolValuePtr + 1) << 2;
  Counting1._4_4_ = 0;
  if (sourceSize == 0) {
    memset(count,0,__n);
    *maxSymbolValuePtr = 0;
    count_local = (uint *)0x0;
  }
  else {
    memset(workSpace,0,0x1000);
    s = MEM_read32(source);
    iend = (BYTE *)((long)source + 4);
    while (iend < (BYTE *)((long)source + sourceSize) + -0xf) {
      UVar1 = MEM_read32(iend);
      workSpace[s & 0xff] = workSpace[s & 0xff] + 1;
      uVar3 = (ulong)(s >> 8 & 0xff);
      workSpace[uVar3 + 0x100] = workSpace[uVar3 + 0x100] + 1;
      uVar3 = (ulong)(s >> 0x10 & 0xff);
      workSpace[uVar3 + 0x200] = workSpace[uVar3 + 0x200] + 1;
      workSpace[(ulong)(s >> 0x18) + 0x300] = workSpace[(ulong)(s >> 0x18) + 0x300] + 1;
      UVar2 = MEM_read32(iend + 4);
      workSpace[UVar1 & 0xff] = workSpace[UVar1 & 0xff] + 1;
      uVar3 = (ulong)(UVar1 >> 8 & 0xff);
      workSpace[uVar3 + 0x100] = workSpace[uVar3 + 0x100] + 1;
      uVar3 = (ulong)(UVar1 >> 0x10 & 0xff);
      workSpace[uVar3 + 0x200] = workSpace[uVar3 + 0x200] + 1;
      workSpace[(ulong)(UVar1 >> 0x18) + 0x300] = workSpace[(ulong)(UVar1 >> 0x18) + 0x300] + 1;
      UVar1 = MEM_read32(iend + 8);
      workSpace[UVar2 & 0xff] = workSpace[UVar2 & 0xff] + 1;
      uVar3 = (ulong)(UVar2 >> 8 & 0xff);
      workSpace[uVar3 + 0x100] = workSpace[uVar3 + 0x100] + 1;
      uVar3 = (ulong)(UVar2 >> 0x10 & 0xff);
      workSpace[uVar3 + 0x200] = workSpace[uVar3 + 0x200] + 1;
      workSpace[(ulong)(UVar2 >> 0x18) + 0x300] = workSpace[(ulong)(UVar2 >> 0x18) + 0x300] + 1;
      s = MEM_read32(iend + 0xc);
      iend = iend + 0x10;
      workSpace[UVar1 & 0xff] = workSpace[UVar1 & 0xff] + 1;
      uVar3 = (ulong)(UVar1 >> 8 & 0xff);
      workSpace[uVar3 + 0x100] = workSpace[uVar3 + 0x100] + 1;
      uVar3 = (ulong)(UVar1 >> 0x10 & 0xff);
      workSpace[uVar3 + 0x200] = workSpace[uVar3 + 0x200] + 1;
      workSpace[(ulong)(UVar1 >> 0x18) + 0x300] = workSpace[(ulong)(UVar1 >> 0x18) + 0x300] + 1;
    }
    iend = iend + -4;
    while (iend < (BYTE *)((long)source + sourceSize)) {
      workSpace[*iend] = workSpace[*iend] + 1;
      iend = iend + 1;
    }
    for (local_8c = 0; local_8c < 0x100; local_8c = local_8c + 1) {
      workSpace[local_8c] =
           workSpace[(ulong)local_8c + 0x100] + workSpace[(ulong)local_8c + 0x200] +
           workSpace[(ulong)local_8c + 0x300] + workSpace[local_8c];
      if (Counting1._4_4_ < workSpace[local_8c]) {
        Counting1._4_4_ = workSpace[local_8c];
      }
    }
    for (local_90 = 0xff; workSpace[local_90] == 0; local_90 = local_90 - 1) {
    }
    if ((check == trustInput) || (local_90 <= *maxSymbolValuePtr)) {
      *maxSymbolValuePtr = local_90;
      memmove(count,workSpace,__n);
      count_local = (uint *)(ulong)Counting1._4_4_;
    }
    else {
      count_local = (uint *)0xffffffffffffffd0;
    }
  }
  return (size_t)count_local;
}

Assistant:

static size_t HIST_count_parallel_wksp(
                                unsigned* count, unsigned* maxSymbolValuePtr,
                                const void* source, size_t sourceSize,
                                HIST_checkInput_e check,
                                U32* const workSpace)
{
    const BYTE* ip = (const BYTE*)source;
    const BYTE* const iend = ip+sourceSize;
    size_t const countSize = (*maxSymbolValuePtr + 1) * sizeof(*count);
    unsigned max=0;
    U32* const Counting1 = workSpace;
    U32* const Counting2 = Counting1 + 256;
    U32* const Counting3 = Counting2 + 256;
    U32* const Counting4 = Counting3 + 256;

    /* safety checks */
    assert(*maxSymbolValuePtr <= 255);
    if (!sourceSize) {
        ZSTD_memset(count, 0, countSize);
        *maxSymbolValuePtr = 0;
        return 0;
    }
    ZSTD_memset(workSpace, 0, 4*256*sizeof(unsigned));

    /* by stripes of 16 bytes */
    {   U32 cached = MEM_read32(ip); ip += 4;
        while (ip < iend-15) {
            U32 c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
            c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
            c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
            c = cached; cached = MEM_read32(ip); ip += 4;
            Counting1[(BYTE) c     ]++;
            Counting2[(BYTE)(c>>8) ]++;
            Counting3[(BYTE)(c>>16)]++;
            Counting4[       c>>24 ]++;
        }
        ip-=4;
    }

    /* finish last symbols */
    while (ip<iend) Counting1[*ip++]++;

    {   U32 s;
        for (s=0; s<256; s++) {
            Counting1[s] += Counting2[s] + Counting3[s] + Counting4[s];
            if (Counting1[s] > max) max = Counting1[s];
    }   }

    {   unsigned maxSymbolValue = 255;
        while (!Counting1[maxSymbolValue]) maxSymbolValue--;
        if (check && maxSymbolValue > *maxSymbolValuePtr) return ERROR(maxSymbolValue_tooSmall);
        *maxSymbolValuePtr = maxSymbolValue;
        ZSTD_memmove(count, Counting1, countSize);   /* in case count & Counting1 are overlapping */
    }
    return (size_t)max;
}